

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peeps.cpp
# Opt level: O2

Instr * Peeps::PeepBranch(BranchInstr *branchInstr,bool *peepedRef)

{
  IRKind IVar1;
  OpCode OVar2;
  Kind KVar3;
  Opnd *this;
  long *plVar4;
  code *pcVar5;
  undefined4 *puVar6;
  bool bVar7;
  OpCode opcode;
  LabelInstr *this_00;
  BranchInstr *pBVar8;
  LabelInstr *pLVar9;
  LabelInstr *pLVar10;
  JITTimeFunctionBody *this_01;
  RegOpnd *this_02;
  StackSym *pSVar11;
  Instr *pIVar12;
  LabelInstr *pLVar13;
  MultiBranchInstr *pMVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  int iVar19;
  Instr *instrTmp;
  void **value;
  anon_class_8_1_3fcf6586_for_fn local_50;
  anon_class_8_1_3fcf6586_for_fn local_48;
  undefined4 *local_40;
  ByteCodeUsesInstr *local_38;
  
  local_40 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
LAB_005acaeb:
  while( true ) {
    if (peepedRef != (bool *)0x0) {
      *peepedRef = false;
    }
    pLVar13 = (((MultiBranchInstr *)branchInstr)->super_BranchInstr).m_branchTarget;
    bVar7 = IR::BranchInstr::IsUnconditional(branchInstr);
    if (bVar7) {
      RemoveDeadBlock((((MultiBranchInstr *)branchInstr)->super_BranchInstr).super_Instr.m_next,
                      (bool *)0x0);
    }
    this_00 = (LabelInstr *)IR::Instr::GetNextRealInstrOrLabel(&branchInstr->super_Instr);
    if ((this_00 == (LabelInstr *)0x0) ||
       ((IVar1 = (this_00->super_Instr).m_kind, pLVar9 = this_00, IVar1 != InstrKindProfiledLabel &&
        (IVar1 != InstrKindLabel)))) break;
    for (; IVar1 = (pLVar9->super_Instr).m_kind, pLVar10 = pLVar9, pLVar9 != pLVar13;
        pLVar9 = (LabelInstr *)IR::Instr::GetNextRealInstrOrLabel(&pLVar9->super_Instr)) {
      if ((IVar1 != InstrKindProfiledLabel) && (IVar1 != InstrKindLabel)) goto LAB_005accd6;
    }
    if ((IVar1 == InstrKindProfiledLabel) || (IVar1 == InstrKindLabel)) {
      if (this_00 == pLVar9) {
        pLVar10 = (LabelInstr *)0x0;
      }
      else {
        pLVar10 = IR::Instr::AsLabelInstr((Instr *)this_00);
        local_38 = (ByteCodeUsesInstr *)CONCAT71(local_38._1_7_,pLVar10->field_0x78);
        pLVar10 = IR::Instr::AsLabelInstr(&pLVar9->super_Instr);
        if ((((byte)local_38 ^ pLVar10->field_0x78) & 2) != 0) {
          pLVar10 = IR::Instr::AsLabelInstr((Instr *)this_00);
          pLVar10->field_0x78 = pLVar10->field_0x78 | 0x20;
        }
        pLVar10 = IR::Instr::AsLabelInstr(&pLVar9->super_Instr);
        local_38 = (ByteCodeUsesInstr *)
                   (CONCAT71(local_38._1_7_,pLVar10->field_0x78) & 0xffffffffffffff02);
        pLVar10 = IR::Instr::AsLabelInstr((Instr *)this_00);
        pLVar10->field_0x78 = (pLVar10->field_0x78 & 0xfd) + (byte)local_38;
        pLVar10 = this_00;
        this_00 = pLVar9;
      }
    }
LAB_005accd6:
    if (pLVar13 != this_00) goto LAB_005acf71;
    if ((((MultiBranchInstr *)branchInstr)->super_BranchInstr).super_Instr.m_opcode < ADD) {
      bVar7 = IR::Instr::HasAnyImplicitCalls(&branchInstr->super_Instr);
      if (bVar7) {
        this_01 = Func::GetJITFunctionBody
                            ((((MultiBranchInstr *)branchInstr)->super_BranchInstr).super_Instr.
                             m_func);
        bVar7 = JITTimeFunctionBody::IsAsmJsMode(this_01);
        if (bVar7) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = local_40;
          *local_40 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                             ,0x1ed,"(!branchInstr->m_func->GetJITFunctionBody()->IsAsmJsMode())",
                             "!branchInstr->m_func->GetJITFunctionBody()->IsAsmJsMode()");
          if (!bVar7) goto LAB_005ad0c3;
          *puVar6 = 0;
        }
        OVar2 = (((MultiBranchInstr *)branchInstr)->super_BranchInstr).super_Instr.m_opcode;
        opcode = DeadBrEqual;
        uVar16 = OVar2 - 0x18e;
        if (uVar16 < 0xe) {
          if ((0x3c0fU >> (uVar16 & 0x1f) & 1) == 0) {
            if ((0xc0U >> (uVar16 & 0x1f) & 1) == 0) {
              if ((0x300U >> (uVar16 & 0x1f) & 1) == 0) goto LAB_005acd90;
LAB_005acdc3:
              opcode = DeadBrSrEqual;
            }
          }
          else {
LAB_005ace77:
            opcode = DeadBrRelational;
          }
        }
        else {
LAB_005acd90:
          uVar16 = (uint)OVar2;
          if (OVar2 < 0x16) {
            if ((0xf0000U >> (OVar2 & 0x1f) & 1) != 0) goto LAB_005ace77;
            if ((0x3000U >> (uVar16 & 0x1f) & 1) != 0) goto LAB_005ace7b;
            if ((0x300000U >> (uVar16 & 0x1f) & 1) != 0) goto LAB_005acdc3;
          }
          if (uVar16 - 0x102 < 2) {
            opcode = DeadBrOnHasProperty;
          }
          else {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar6 = local_40;
            *local_40 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                               ,0x216,"((0))","UNREACHED");
            if (!bVar7) goto LAB_005ad0c3;
            *puVar6 = 0;
            opcode = Nop;
          }
        }
LAB_005ace7b:
        pIVar12 = IR::Instr::New(opcode,(((MultiBranchInstr *)branchInstr)->super_BranchInstr).
                                        super_Instr.m_func);
        IR::Instr::SetSrc1(pIVar12,(((MultiBranchInstr *)branchInstr)->super_BranchInstr).
                                   super_Instr.m_src1);
        IR::Instr::SetSrc2(pIVar12,(((MultiBranchInstr *)branchInstr)->super_BranchInstr).
                                   super_Instr.m_src2);
        IR::Instr::InsertBefore(&branchInstr->super_Instr,pIVar12);
        IR::Instr::SetByteCodeOffset(pIVar12,&branchInstr->super_Instr);
      }
      else {
        this = (((MultiBranchInstr *)branchInstr)->super_BranchInstr).super_Instr.m_src1;
        if ((this != (Opnd *)0x0) &&
           ((((MultiBranchInstr *)branchInstr)->super_BranchInstr).super_Instr.m_src2 == (Opnd *)0x0
           )) {
          bVar7 = IR::Opnd::IsRegOpnd(this);
          if (!bVar7) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar6 = local_40;
            *local_40 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                               ,0x222,"(branchInstr->GetSrc1()->IsRegOpnd())",
                               "branchInstr->GetSrc1()->IsRegOpnd()");
            if (!bVar7) goto LAB_005ad0c3;
            *puVar6 = 0;
          }
          this_02 = IR::Opnd::AsRegOpnd((((MultiBranchInstr *)branchInstr)->super_BranchInstr).
                                        super_Instr.m_src1);
          pSVar11 = IR::Opnd::GetStackSym(&this_02->super_Opnd);
          if (((pSVar11->field_0x19 & 0x20) != 0) && (((this_02->super_Opnd).field_0xb & 8) == 0)) {
            local_38 = IR::ByteCodeUsesInstr::New(&branchInstr->super_Instr);
            IR::ByteCodeUsesInstr::Set(local_38,&this_02->super_Opnd);
            IR::Instr::InsertBefore(&branchInstr->super_Instr,&local_38->super_Instr);
          }
        }
      }
    }
    if (peepedRef != (bool *)0x0) {
      *peepedRef = true;
    }
    IR::Instr::Remove(&branchInstr->super_Instr);
    if (((SListCounted<IR::BranchInstr_*,_Memory::ArenaAllocator> *)
         (pLVar13->labelRefs).super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
         super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
         super_SListNodeBase<Memory::ArenaAllocator>.next == &pLVar13->labelRefs) &&
       ((pLVar13->field_0x78 & 4) == 0)) {
      pLVar13 = (LabelInstr *)PeepUnreachableLabel(pLVar13,false,(bool *)0x0);
    }
    pIVar12 = IR::Instr::GetPrevRealInstrOrLabel(&pLVar13->super_Instr);
    if (pIVar12->m_kind != InstrKindBranch) {
      if (pLVar10 != (LabelInstr *)0x0) {
        pLVar13 = pLVar10;
      }
      return &pLVar13->super_Instr;
    }
    branchInstr = IR::Instr::AsBranchInstr(pIVar12);
    peepedRef = (bool *)0x0;
  }
  bVar7 = IR::BranchInstr::IsConditional(branchInstr);
  if (bVar7) {
    if (this_00 == (LabelInstr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = local_40;
      *local_40 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                         ,0x251,"(instrNext)","instrNext");
      if (!bVar7) goto LAB_005ad0c3;
      *puVar6 = 0;
    }
    if ((this_00->super_Instr).m_kind == InstrKindBranch) {
      pBVar8 = IR::Instr::AsBranchInstr((Instr *)this_00);
      bVar7 = IR::BranchInstr::IsUnconditional(pBVar8);
      if (bVar7) {
        pBVar8 = IR::Instr::AsBranchInstr((Instr *)this_00);
        pLVar9 = (LabelInstr *)IR::Instr::GetNextRealInstrOrLabel(&pBVar8->super_Instr);
        if (pLVar13 == pLVar9) {
          pBVar8 = IR::Instr::AsBranchInstr((Instr *)this_00);
          bVar7 = IR::BranchInstr::IsMultiBranch(pBVar8);
          if (!bVar7) {
            pBVar8 = IR::Instr::AsBranchInstr((Instr *)this_00);
            if ((((MultiBranchInstr *)branchInstr)->super_BranchInstr).super_Instr.m_opcode < ADD) {
              IR::BranchInstr::Invert(branchInstr);
            }
            else {
              LowererMD::InvertBranch(branchInstr);
            }
            pLVar13 = pBVar8->m_branchTarget;
            IR::BranchInstr::SetTarget(branchInstr,pLVar13);
            if (((SListCounted<IR::BranchInstr_*,_Memory::ArenaAllocator> *)
                 (pLVar13->labelRefs).
                 super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                 super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                 super_SListNodeBase<Memory::ArenaAllocator>.next == &pLVar13->labelRefs) &&
               ((pLVar13->field_0x78 & 4) == 0)) {
              PeepUnreachableLabel(pLVar13,false,(bool *)0x0);
            }
            IR::Instr::Remove(&pBVar8->super_Instr);
            goto LAB_005acaeb;
          }
        }
      }
    }
  }
LAB_005acf71:
  bVar7 = IR::BranchInstr::IsMultiBranch(branchInstr);
  if (bVar7) {
    pMVar14 = IR::BranchInstr::AsMultiBrInstr(branchInstr);
    plVar4 = (long *)pMVar14->m_branchTargets;
    if (plVar4 != (long *)0x0) {
      KVar3 = pMVar14->m_kind;
      local_48.fn.this = (anon_class_8_1_8991fb9c_for_fn)(anon_class_8_1_8991fb9c_for_fn)branchInstr
      ;
      if ((KVar3 == IntJumpTable) || (KVar3 == SingleCharStrJumpTable)) {
        lVar15 = pMVar14->m_baseCaseValue;
        lVar18 = lVar15 * 8 + *plVar4;
        for (; lVar15 <= pMVar14->m_lastCaseValue; lVar15 = lVar15 + 1) {
          anon_func::anon_class_8_1_3fcf6586::anon_class_8_1_3fcf6586_for_fn::
          anon_class_8_1_3fcf6586_for_fn::anon_class_8_1_3fcf6586_for_fn::operator()
                    (&local_48,(void **)(lVar18 + pMVar14->m_baseCaseValue * -8));
          lVar18 = lVar18 + 8;
        }
        value = (void **)(plVar4 + 1);
      }
      else if (KVar3 == StrDictionary) {
        local_50.fn.this =
             (anon_class_8_1_8991fb9c_for_fn)(anon_class_8_1_8991fb9c_for_fn)branchInstr;
        for (uVar17 = 0; uVar17 < *(uint *)((long)plVar4 + 0x1c); uVar17 = uVar17 + 1) {
          iVar19 = *(int *)(*plVar4 + uVar17 * 4);
          if (iVar19 != -1) {
            while (iVar19 != -1) {
              lVar15 = (long)iVar19;
              iVar19 = *(int *)(plVar4[1] + 8 + lVar15 * 0x18);
              anon_func::anon_class_8_1_3fcf6586::anon_class_8_1_3fcf6586_for_fn::
              anon_class_8_1_3fcf6586_for_fn::anon_class_8_1_3fcf6586_for_fn::operator()
                        (&local_50,(void **)(plVar4[1] + lVar15 * 0x18));
            }
          }
        }
        value = (void **)(plVar4 + 7);
      }
      else {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = local_40;
        *local_40 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x435,"(false)","false");
        if (!bVar7) {
LAB_005ad0c3:
          pcVar5 = (code *)invalidInstructionException();
          (*pcVar5)();
        }
        *puVar6 = 0;
        value = (void **)0x0;
      }
      anon_func::anon_class_8_1_3fcf6586::anon_class_8_1_3fcf6586_for_fn::
      anon_class_8_1_3fcf6586_for_fn::anon_class_8_1_3fcf6586_for_fn::operator()(&local_48,value);
    }
  }
  else {
    RetargetBrToBr(branchInstr,pLVar13);
  }
  return (((MultiBranchInstr *)branchInstr)->super_BranchInstr).super_Instr.m_next;
}

Assistant:

IR::Instr *
Peeps::PeepBranch(IR::BranchInstr *branchInstr, bool *const peepedRef)
{
    if(peepedRef)
    {
        *peepedRef = false;
    }

    IR::LabelInstr *targetInstr = branchInstr->GetTarget();
    IR::Instr *instrNext;

    if (branchInstr->IsUnconditional())
    {
        // Cleanup unreachable code after unconditional branch
        instrNext = RemoveDeadBlock(branchInstr->m_next);
    }

    instrNext = branchInstr->GetNextRealInstrOrLabel();

    if (instrNext != NULL && instrNext->IsLabelInstr())
    {
        //
        // Remove branch-to-next
        //
        IR::Instr * instrSkip = instrNext;
        while (instrSkip != targetInstr && instrSkip->IsLabelInstr())
        {
            // Skip adjacent labels
            instrSkip = instrSkip->GetNextRealInstrOrLabel();
        }
        if (instrSkip->IsLabelInstr())
        {
            if (instrNext == instrSkip)
            {
                instrSkip = nullptr;
            }
            else
            {
                IR::Instr *instrTmp = instrSkip;

                // Ignore assertion error for cases where we insert an "airlock" helper block
                // for a Branch instruction's helper path that:
                //  1) ends up being empty
                //  2) comes after a helper block from another instruction
                //  3) is followed by a non-helper block
                //
                // Propagating the "isOpHelper" flag can potentially make this block a non-helper,
                // and that makes this block only reachable through helper blocks, thus failing the assert 
#if DBG
                if (instrNext->AsLabelInstr()->isOpHelper != instrSkip->AsLabelInstr()->isOpHelper)
                {
                    instrNext->AsLabelInstr()->m_noHelperAssert = true;
                }
#endif
                instrNext->AsLabelInstr()->isOpHelper = instrSkip->AsLabelInstr()->isOpHelper;
                instrSkip = instrNext;
                instrNext = instrTmp;
            }
        }
        if (targetInstr == instrNext)
        {
            if (!branchInstr->IsLowered())
            {
                if (branchInstr->HasAnyImplicitCalls())
                {
                    Assert(!branchInstr->m_func->GetJITFunctionBody()->IsAsmJsMode());
                    // if (x > y) might trigger a call to valueof() or something for x and y.
                    // We can't just delete them.
                    Js::OpCode newOpcode;
                    switch(branchInstr->m_opcode)
                    {
                    case Js::OpCode::BrEq_A:
                    case Js::OpCode::BrNeq_A:
                    case Js::OpCode::BrNotEq_A:
                    case Js::OpCode::BrNotNeq_A:
                        newOpcode = Js::OpCode::DeadBrEqual;
                        break;

                    case Js::OpCode::BrSrEq_A:
                    case Js::OpCode::BrSrNeq_A:
                    case Js::OpCode::BrSrNotEq_A:
                    case Js::OpCode::BrSrNotNeq_A:
                        newOpcode = Js::OpCode::DeadBrSrEqual;
                        break;

                    case Js::OpCode::BrGe_A:
                    case Js::OpCode::BrGt_A:
                    case Js::OpCode::BrLe_A:
                    case Js::OpCode::BrLt_A:
                    case Js::OpCode::BrNotGe_A:
                    case Js::OpCode::BrNotGt_A:
                    case Js::OpCode::BrNotLe_A:
                    case Js::OpCode::BrNotLt_A:
                    case Js::OpCode::BrUnGe_A:
                    case Js::OpCode::BrUnGt_A:
                    case Js::OpCode::BrUnLe_A:
                    case Js::OpCode::BrUnLt_A:
                        newOpcode = Js::OpCode::DeadBrRelational;
                        break;

                    case Js::OpCode::BrOnHasProperty:
                    case Js::OpCode::BrOnNoProperty:
                        newOpcode = Js::OpCode::DeadBrOnHasProperty;
                        break;

                    default:
                        Assert(UNREACHED);
                        newOpcode = Js::OpCode::Nop;
                    }
                    IR::Instr *newInstr = IR::Instr::New(newOpcode, branchInstr->m_func);
                    newInstr->SetSrc1(branchInstr->GetSrc1());
                    newInstr->SetSrc2(branchInstr->GetSrc2());
                    branchInstr->InsertBefore(newInstr);
                    newInstr->SetByteCodeOffset(branchInstr);
                }
                else if (branchInstr->GetSrc1() && !branchInstr->GetSrc2())
                {
                    // We only have cases with one src
                    Assert(branchInstr->GetSrc1()->IsRegOpnd());

                    IR::RegOpnd *regSrc = branchInstr->GetSrc1()->AsRegOpnd();
                    StackSym *symSrc = regSrc->GetStackSym();

                    if (symSrc->HasByteCodeRegSlot() && !regSrc->GetIsJITOptimizedReg())
                    {
                        // No side-effects to worry about, but need to insert bytecodeUse.
                        IR::ByteCodeUsesInstr *byteCodeUsesInstr = IR::ByteCodeUsesInstr::New(branchInstr);
                        byteCodeUsesInstr->Set(regSrc);
                        branchInstr->InsertBefore(byteCodeUsesInstr);
                    }
                }
            }
            // Note: if branch is conditional, we have a dead test/cmp left behind...
            if(peepedRef)
            {
                *peepedRef = true;
            }
            branchInstr->Remove();
            if (targetInstr->IsUnreferenced())
            {
                // We may have exposed an unreachable label by deleting the branch
                instrNext = Peeps::PeepUnreachableLabel(targetInstr, false);
            }
            else
            {
                instrNext = targetInstr;
            }
            IR::Instr *instrPrev = instrNext->GetPrevRealInstrOrLabel();
            if (instrPrev->IsBranchInstr())
            {
                // The branch removal could have exposed a branch to next opportunity.
                return Peeps::PeepBranch(instrPrev->AsBranchInstr());
            }
            if (instrSkip)
            {
                return instrSkip;
            }
            else
            {
                return instrNext;
            }
        }
    }
    else if (branchInstr->IsConditional())
    {
        AnalysisAssert(instrNext);
        if (instrNext->IsBranchInstr()
            && instrNext->AsBranchInstr()->IsUnconditional()
            && targetInstr == instrNext->AsBranchInstr()->GetNextRealInstrOrLabel()
            && !instrNext->AsBranchInstr()->IsMultiBranch())
        {
            //
            // Invert condBranch/uncondBranch/label:
            //
            //      JCC L1                   JinvCC L3
            //      JMP L3       =>
            //      L1:
            IR::BranchInstr *uncondBranch = instrNext->AsBranchInstr();

            if (branchInstr->IsLowered())
            {
                LowererMD::InvertBranch(branchInstr);
            }
            else
            {
                branchInstr->Invert();
            }

            targetInstr = uncondBranch->GetTarget();
            branchInstr->SetTarget(targetInstr);
            if (targetInstr->IsUnreferenced())
            {
                Peeps::PeepUnreachableLabel(targetInstr, false);
            }

            uncondBranch->Remove();

            return PeepBranch(branchInstr, peepedRef);
        }
    }

    if(branchInstr->IsMultiBranch())
    {
        IR::MultiBranchInstr * multiBranchInstr = branchInstr->AsMultiBrInstr();

        multiBranchInstr->UpdateMultiBrLabels([=](IR::LabelInstr * targetInstr) -> IR::LabelInstr *
        {
            IR::LabelInstr * labelInstr = RetargetBrToBr(branchInstr, targetInstr);
            return labelInstr;
        });
    }
    else
    {
        RetargetBrToBr(branchInstr, targetInstr);
    }

    return branchInstr->m_next;
}